

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_id.h
# Opt level: O3

S2CellId __thiscall S2CellId::parent(S2CellId *this,int level)

{
  ulong uVar1;
  ulong uVar2;
  byte bVar3;
  S2LogMessage SStack_18;
  
  uVar1 = this->id_;
  if (((uint)(uVar1 >> 0x3e) < 3) && ((uVar1 & 0x1555555555555555 & -uVar1) != 0)) {
    if (level < 0) {
      S2LogMessage::S2LogMessage
                (&SStack_18,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cell_id.h"
                 ,0x263,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                (SStack_18.stream_,"Check failed: (level) >= (0) ",0x1d);
    }
    else if (uVar1 == 0) {
      S2LogMessage::S2LogMessage
                (&SStack_18,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cell_id.h"
                 ,0x223,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                (SStack_18.stream_,"Check failed: id_ != 0 ",0x17);
    }
    else {
      uVar2 = 0;
      if (uVar1 != 0) {
        for (; (uVar1 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
        }
      }
      if (level <= (int)(0x1e - ((uint)(uVar2 >> 1) & 0x7fffffff))) {
        bVar3 = (char)level * -2 + 0x3c;
        return (S2CellId)(uVar1 & -(1L << (bVar3 & 0x3f)) | 1L << ((ulong)bVar3 & 0x3f));
      }
      S2LogMessage::S2LogMessage
                (&SStack_18,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cell_id.h"
                 ,0x264,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                (SStack_18.stream_,"Check failed: (level) <= (this->level()) ",0x29);
    }
  }
  else {
    S2LogMessage::S2LogMessage
              (&SStack_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cell_id.h"
               ,0x262,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (SStack_18.stream_,"Check failed: is_valid() ",0x19);
  }
  abort();
}

Assistant:

inline int S2CellId::face() const {
  return id_ >> kPosBits;
}